

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.cpp
# Opt level: O0

void __thiscall Item::ResetPosition(Item *this)

{
  result_type rVar1;
  int iVar2;
  result_type_conflict1 rVar3;
  ostream *poVar4;
  uniform_int_distribution<int> local_13bc;
  uniform_int_distribution<int> distribution_y;
  uniform_int_distribution<int> distribution_x;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13a0;
  default_random_engine generator;
  random_device dev;
  Item *this_local;
  
  std::random_device::random_device((random_device *)&generator);
  rVar1 = std::random_device::operator()((random_device *)&generator);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_13a0,(ulong)rVar1);
  iVar2 = GameObject::getGridWidth(&this->super_GameObject);
  std::uniform_int_distribution<int>::uniform_int_distribution(&distribution_y,0,iVar2);
  iVar2 = GameObject::getGridHeight(&this->super_GameObject);
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_13bc,0,iVar2);
  rVar3 = std::uniform_int_distribution<int>::operator()(&distribution_y,&local_13a0);
  (this->super_GameObject).pos_x = (float)rVar3;
  rVar3 = std::uniform_int_distribution<int>::operator()(&local_13bc,&local_13a0);
  (this->super_GameObject).pos_y = (float)rVar3;
  poVar4 = std::operator<<((ostream *)&std::cout,"Position reset to x:");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->super_GameObject).pos_x);
  poVar4 = std::operator<<(poVar4," and y:");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->super_GameObject).pos_y);
  std::operator<<(poVar4,"\n");
  std::random_device::~random_device((random_device *)&generator);
  return;
}

Assistant:

void Item::ResetPosition()
 {
//reset the position of the object to one of the four sides of the screen randomly
  
  std::random_device dev;
  std::default_random_engine generator(dev());
  std::uniform_int_distribution<int> distribution_x(0,getGridWidth());
  std::uniform_int_distribution<int> distribution_y(0,getGridHeight());
  this->pos_x= distribution_x(generator);
  this->pos_y= distribution_y(generator);
  std::cout << "Position reset to x:" << pos_x << " and y:" << pos_y <<"\n";
  
 }